

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmcursor.cpp
# Opt level: O0

void __thiscall QEglFSKmsGbmCursor::updateMouseStatus(QEglFSKmsGbmCursor *this)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  bool visible;
  bool wasVisible;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = in_RDI[10];
  bVar3 = QEglFSKmsGbmCursorDeviceListener::hasMouse((QEglFSKmsGbmCursorDeviceListener *)0x111f6c);
  if (bVar3 != ((int)lVar2 == 4)) {
    uVar4 = 1;
    if (bVar3) {
      uVar4 = 3;
    }
    *(undefined4 *)(in_RDI + 10) = uVar4;
    plVar1 = (long *)in_RDI[2];
    local_10 = (**(code **)(*in_RDI + 0x80))();
    uVar5 = (**(code **)(*plVar1 + 0x80))(plVar1,&local_10);
    (**(code **)(*in_RDI + 0x68))(in_RDI,0,uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSKmsGbmCursor::updateMouseStatus()
{
    const bool wasVisible = m_state == CursorVisible;
    const bool visible = m_deviceListener->hasMouse();
    if (visible == wasVisible)
        return;

    m_state = visible ? CursorPendingVisible : CursorPendingHidden;

#ifndef QT_NO_CURSOR
    changeCursor(nullptr, m_screen->topLevelAt(pos()));
#endif
}